

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new_meshfile_operations.cpp
# Opt level: O1

double MSH::vol_tetrahedron(node *a,node *b,node *c,node *d)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  dVar1 = d->x;
  dVar2 = d->y;
  dVar3 = d->z;
  dVar5 = b->x - dVar1;
  dVar7 = b->y - dVar2;
  dVar8 = b->z - dVar3;
  dVar6 = c->x - dVar1;
  dVar4 = c->y - dVar2;
  dVar9 = c->z - dVar3;
  return ABS((dVar4 * dVar5 - dVar6 * dVar7) * (a->z - dVar3) +
             (dVar6 * dVar8 - dVar9 * dVar5) * (a->y - dVar2) +
             (dVar7 * dVar9 - dVar8 * dVar4) * (a->x - dVar1)) / 6.0;
}

Assistant:

double MSH::vol_tetrahedron(const node &a, const node &b, const node &c, const node &d)
{
    node a_minus_d, b_minus_d, c_minus_d;
    a_minus_d.x = a.x - d.x;
    a_minus_d.y = a.y - d.y;
    a_minus_d.z = a.z - d.z;
    b_minus_d.x = b.x - d.x;
    b_minus_d.y = b.y - d.y;
    b_minus_d.z = b.z - d.z;
    c_minus_d.x = c.x - d.x;
    c_minus_d.y = c.y - d.y;
    c_minus_d.z = c.z - d.z;
    node b_minus_d_X_c_minus_d;
    cross_product(b_minus_d,c_minus_d, b_minus_d_X_c_minus_d);
    double volume = std::abs(dot_product(a_minus_d,b_minus_d_X_c_minus_d))/6;
    return volume;
}